

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined4 uVar3;
  MemoryMonitorInterface *pMVar4;
  ThreadLocal2 *pTVar5;
  iterator iVar6;
  BBox1f *pBVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
  *this_00;
  vint *pvVar19;
  unsigned_long uVar20;
  unsigned_long uVar21;
  char cVar22;
  long lVar23;
  long lVar24;
  SetMB *this_01;
  BBox1f BVar25;
  long lVar26;
  void *pvVar27;
  size_t sVar28;
  undefined8 *puVar29;
  runtime_error *prVar30;
  int iVar31;
  long lVar32;
  BBox1f BVar33;
  uint *puVar34;
  float *pfVar35;
  BBox1f *pBVar36;
  BBox1f BVar37;
  mvector<PrimRefMB> *prims;
  char *pcVar38;
  ulong uVar39;
  byte bVar40;
  BuildRecord *in_00;
  undefined8 uVar41;
  ulong uVar42;
  byte bVar43;
  BBox1f BVar44;
  NodeRecordMB4D *pNVar45;
  int iVar46;
  int iVar47;
  bool bVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar90;
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 local_1e58 [16];
  undefined8 uStack_1e50;
  BBox1f local_1e40;
  BBox1f local_1e38;
  BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
  *local_1e30;
  undefined1 local_1e28 [8];
  float fStack_1e20;
  float fStack_1e1c;
  NodeRecordMB4D *local_1e18;
  size_t *local_1e10;
  undefined1 local_1e08 [8];
  undefined8 uStack_1e00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1df8;
  undefined1 local_1de8 [8];
  undefined8 uStack_1de0;
  ulong local_1dd0;
  pointer *local_1dc8;
  Split *local_1dc0;
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  BBox<embree::Vec3fa> bi;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1ca8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1c88;
  BBox1f local_1c78;
  BBox1f BStack_1c70;
  pointer ppTStack_1c68;
  pointer ppTStack_1c60;
  float local_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  anon_class_1_0_00000001 reduction;
  BBox<embree::Vec3fa> blower1;
  undefined1 auStack_1c08 [16];
  undefined1 local_1bf8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1be8;
  BBox1f local_1bd8;
  size_t sStack_1bd0;
  size_t sStack_1bc8;
  BBox1f BStack_1bc0;
  BBox1f local_1bb8;
  BBox1f BStack_1bb0;
  pointer ppTStack_1ba8;
  size_t sStack_1ba0;
  undefined1 auStack_1b98 [16];
  BBox1f local_1b88;
  size_t local_1b78 [4];
  BBox1f *local_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 uStack_1b40;
  BBox<embree::Vec3fa> bupper0;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  BBox1f local_1ac8;
  BBox1f BStack_1ac0;
  size_t sStack_1ab8;
  size_t sStack_1ab0;
  undefined1 auStack_1aa8 [16];
  BBox1f local_1a98;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  BBox1f *local_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a38;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  BuildRecordSplit current;
  BBox<embree::Vec3fa> blower0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_17a8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1798;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  undefined1 local_1768 [16];
  BBox1f local_1758 [2];
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  undefined8 local_838 [14];
  BBox1f aBStack_7c8 [49];
  long local_640;
  NodeRecordMB4D values [16];
  
  local_1a38._8_8_ = local_1a38._0_8_;
  uVar39 = in->depth;
  local_1e18 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar39) {
    puVar29 = (undefined8 *)__cxa_allocate_exception(0x30);
    blower0.lower.field_0._0_8_ = &blower0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&blower0,"depth limit reached","");
    *puVar29 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar29 + 1) = 1;
    puVar29[2] = puVar29 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar29 + 2),blower0.lower.field_0._0_8_,
               CONCAT44(blower0.lower.field_0.m128[3],blower0.lower.field_0.m128[2]) +
               blower0.lower.field_0._0_8_);
    __cxa_throw(puVar29,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  _local_1e08 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128;
  _local_1de8 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.upper.field_0.m128;
  aVar63 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
            (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds1.lower.field_0.m128;
  _local_1e28 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds1.upper.field_0.m128;
  local_1df8 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                centBounds.lower.field_0.m128;
  aVar68 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
            (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
            upper.field_0.m128;
  local_1e38 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar33 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar37 = (BBox1f)(in->prims).prims;
  findFallback((Split *)&blower0,this,&in->prims);
  local_1718[0].mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  BVar44 = local_1e38;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0 = _local_1e08;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._0_8_ = local_1de8;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._8_8_ = uStack_1de0;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0 = _local_1e28;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0 = local_1df8;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin._0_4_ = local_1e38.lower;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin._4_4_ = local_1e38.upper;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar25 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.split.sah = (float)blower0.lower.field_0._0_4_;
  current.split.dim = blower0.lower.field_0._4_4_;
  local_1718[0].mapping.num = blower0.upper.field_0._0_8_;
  current.split.mapping.num = blower0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  current.split.mapping.scale.field_0 = local_1798;
  local_1dd0 = (long)BVar33 - (long)local_1e38;
  local_1a38._0_8_ = in;
  if (local_1dd0 == 0 || uVar39 != 1) {
    bVar40 = 0;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar32 = (long)BVar33 - (long)local_1e38;
    if ((ulong)BVar33 < (ulong)local_1e38 || lVar32 == 0) {
      auVar55 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar36 = &(*(PrimRefMB **)((long)BVar37 + 0x20))[(long)local_1e38].time_range;
      auVar55 = ZEXT816(0xff8000007f800000);
      do {
        auVar76._8_8_ = 0;
        auVar76._0_4_ = pBVar36->lower;
        auVar76._4_4_ = pBVar36->upper;
        auVar52 = vcmpps_avx(auVar55,auVar76,1);
        auVar51 = vinsertps_avx(auVar55,auVar76,0x50);
        auVar55 = vblendps_avx(auVar76,auVar55,2);
        auVar55 = vblendvps_avx(auVar55,auVar51,auVar52);
        pBVar36 = pBVar36 + 10;
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
    }
    auVar52 = vmovshdup_avx(auVar55);
    auVar52 = vcmpps_avx(auVar52,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                               time_range.upper),1);
    auVar55 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range.
                                       lower),auVar55,1);
    auVar55 = vorps_avx(auVar55,auVar52);
    bVar40 = auVar55[0] & 1;
  }
  local_1e30 = this;
  current.super_BuildRecord.depth = uVar39;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0 = aVar63;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0 = aVar68;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = (unsigned_long)BVar33;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar25;
  current.super_BuildRecord.prims.prims = (PrimRefVector)BVar37;
  if (((local_1dd0 <= (this->cfg).maxLeafSize) && ((uint)blower0.lower.field_0._12_4_ < 2)) &&
     (bVar40 == 0)) {
    bupper0.lower.field_0._0_8_ = local_1dd0 * 8;
    pTVar5 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar5->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar5;
      MutexSys::lock(&pTVar5->mutex);
      if ((pTVar5->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar5->alloc1).bytesUsed + (pTVar5->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar5->alloc0).end + (pTVar5->alloc1).end) -
             ((pTVar5->alloc0).cur + (pTVar5->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar5->alloc1).bytesWasted + (pTVar5->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar5->alloc0).end = auVar58._0_8_;
      (pTVar5->alloc0).allocBlockSize = auVar58._8_8_;
      (pTVar5->alloc0).bytesUsed = auVar58._16_8_;
      (pTVar5->alloc0).bytesWasted = auVar58._24_8_;
      (pTVar5->alloc0).ptr = (char *)auVar58._0_8_;
      (pTVar5->alloc0).cur = auVar58._8_8_;
      (pTVar5->alloc0).end = auVar58._16_8_;
      (pTVar5->alloc0).allocBlockSize = auVar58._24_8_;
      auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar5->alloc1).end = auVar58._0_8_;
        (pTVar5->alloc1).allocBlockSize = auVar58._8_8_;
        (pTVar5->alloc1).bytesUsed = auVar58._16_8_;
        (pTVar5->alloc1).bytesWasted = auVar58._24_8_;
        (pTVar5->alloc1).ptr = (char *)auVar58._0_8_;
        (pTVar5->alloc1).cur = auVar58._8_8_;
        (pTVar5->alloc1).end = auVar58._16_8_;
        (pTVar5->alloc1).allocBlockSize = auVar58._24_8_;
      }
      else {
        (pTVar5->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar5->alloc1).ptr = (char *)auVar58._0_8_;
        (pTVar5->alloc1).cur = auVar58._8_8_;
        (pTVar5->alloc1).end = auVar58._16_8_;
        (pTVar5->alloc1).allocBlockSize = auVar58._24_8_;
        (pTVar5->alloc1).end = auVar58._0_8_;
        (pTVar5->alloc1).allocBlockSize = auVar58._8_8_;
        (pTVar5->alloc1).bytesUsed = auVar58._16_8_;
        (pTVar5->alloc1).bytesWasted = auVar58._24_8_;
        (pTVar5->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar5->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      blower0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower0.lower.field_0._8_1_ = 1;
      blower1.lower.field_0._0_8_ = pTVar5;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar6._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar6,(ThreadLocal2 **)&blower1);
      }
      else {
        *iVar6._M_current = (ThreadLocal2 *)blower1.lower.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    uVar41 = bupper0.lower.field_0._0_8_;
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + bupper0.lower.field_0._0_8_;
    sVar28 = (alloc.talloc1)->cur;
    uVar39 = (ulong)(-(int)sVar28 & 0xf);
    uVar42 = sVar28 + bupper0.lower.field_0._0_8_ + uVar39;
    (alloc.talloc1)->cur = uVar42;
    if ((alloc.talloc1)->end < uVar42) {
      (alloc.talloc1)->cur = sVar28;
      uVar39 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(bupper0.lower.field_0._0_8_ * 4) < uVar39 ||
          bupper0.lower.field_0._0_8_ * 4 - uVar39 == 0) {
        blower0.lower.field_0._0_8_ = uVar39;
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower0);
        (alloc.talloc1)->ptr = pcVar38;
        sVar28 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar28;
        (alloc.talloc1)->end = blower0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = uVar41;
        if ((ulong)blower0.lower.field_0._0_8_ < (ulong)uVar41) {
          (alloc.talloc1)->cur = 0;
          blower0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower0);
          (alloc.talloc1)->ptr = pcVar38;
          sVar28 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar28;
          (alloc.talloc1)->end = blower0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = uVar41;
          if ((ulong)blower0.lower.field_0._0_8_ < (ulong)uVar41) {
            (alloc.talloc1)->cur = 0;
            pcVar38 = (char *)0x0;
            this = local_1e30;
            goto LAB_0133ff06;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar28;
        this = local_1e30;
      }
      else {
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&bupper0);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar39;
      pcVar38 = (alloc.talloc1)->ptr + (uVar42 - bupper0.lower.field_0._0_8_);
    }
LAB_0133ff06:
    uVar39 = 7;
    if (local_1dd0 < 7) {
      uVar39 = local_1dd0;
    }
    if (BVar33 == BVar44) {
      aVar68.m128[2] = -INFINITY;
      aVar68._0_8_ = 0xff800000ff800000;
      aVar68.m128[3] = -INFINITY;
      local_1a48.m128[2] = INFINITY;
      local_1a48._0_8_ = 0x7f8000007f800000;
      local_1a48.m128[3] = INFINITY;
      local_1a38 = local_1a48;
      aVar63 = aVar68;
    }
    else {
      local_1a38.m128[2] = INFINITY;
      local_1a38._0_8_ = 0x7f8000007f800000;
      local_1a38.m128[3] = INFINITY;
      aVar63.m128[2] = -INFINITY;
      aVar63._0_8_ = 0xff800000ff800000;
      aVar63.m128[3] = -INFINITY;
      uVar42 = 0;
      aVar68 = aVar63;
      local_1a48 = local_1a38;
      do {
        pSVar8 = ((this->createLeaf).bvh)->scene;
        auVar54._8_8_ = 0;
        auVar54._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
        auVar54._4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        fVar90 = (current.super_BuildRecord.prims.prims)->items[(long)BVar44].lbounds.bounds0.lower.
                 field_0.m128[3];
        fVar78 = *(float *)((long)&(current.super_BuildRecord.prims.prims)->items[(long)BVar44].
                                   lbounds.bounds0.upper.field_0 + 0xc);
        *(float *)(pcVar38 + uVar42 * 8) = fVar90;
        *(float *)(pcVar38 + uVar42 * 8 + 4) = fVar78;
        pGVar9 = (pSVar8->geometries).items[(uint)fVar90].ptr;
        fVar90 = pGVar9->fnumTimeSegments;
        fVar91 = (pGVar9->time_range).lower;
        fVar49 = (pGVar9->time_range).upper - fVar91;
        fVar85 = (current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower - fVar91) /
                 fVar49;
        auVar55 = vmovshdup_avx(auVar54);
        fVar49 = (auVar55._0_4_ - fVar91) / fVar49;
        local_1dc0 = (Split *)CONCAT44(local_1dc0._4_4_,fVar85);
        fVar85 = fVar90 * fVar85;
        local_1e10 = (size_t *)CONCAT44(local_1e10._4_4_,fVar49);
        fVar49 = fVar90 * fVar49;
        auVar51 = vroundss_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),9);
        local_1e08._0_4_ = fVar49;
        auVar76 = vroundss_avx(ZEXT416((uint)fVar49),ZEXT416((uint)fVar49),10);
        auVar55 = vmaxss_avx(auVar51,ZEXT816(0) << 0x40);
        local_1e28._0_4_ = auVar55._0_4_;
        auVar52 = vminss_avx(auVar76,ZEXT416((uint)fVar90));
        iVar31 = (int)auVar55._0_4_;
        local_1de8._0_4_ = auVar52._0_4_;
        iVar47 = (int)auVar52._0_4_;
        iVar46 = (int)auVar51._0_4_;
        if ((int)auVar51._0_4_ < 0) {
          iVar46 = -1;
        }
        local_1dc8 = (pointer *)CONCAT44(local_1dc8._4_4_,fVar90);
        iVar10 = (int)fVar90 + 1;
        if ((int)auVar76._0_4_ < (int)fVar90 + 1) {
          iVar10 = (int)auVar76._0_4_;
        }
        values[0].ref.ptr = (size_t)pGVar9->userPtr;
        values[0].lbounds.bounds0.lower.field_0._0_8_ = &blower0;
        local_1e38 = BVar44;
        values[0]._8_4_ = fVar78;
        values[0]._12_4_ = iVar31;
        (**(code **)&pGVar9->field_0x58)(values);
        blower1.lower.field_0._0_8_ = pGVar9->userPtr;
        local_1df8.m128[0] = (float)iVar47;
        blower1.lower.field_0.m128[3] = (float)iVar47;
        blower1.lower.field_0.m128[2] = fVar78;
        blower1.upper.field_0._0_8_ = values;
        (**(code **)&pGVar9->field_0x58)(&blower1);
        fVar85 = fVar85 - (float)local_1e28._0_4_;
        if (iVar10 - iVar46 == 1) {
          auVar55 = vmaxss_avx(ZEXT416((uint)fVar85),ZEXT816(0) << 0x40);
          auVar52 = vshufps_avx(auVar55,auVar55,0);
          auVar55 = ZEXT416((uint)(1.0 - auVar55._0_4_));
          auVar55 = vshufps_avx(auVar55,auVar55,0);
          auVar82._0_4_ =
               auVar52._0_4_ * (float)values[0].ref.ptr +
               auVar55._0_4_ * blower0.lower.field_0.m128[0];
          auVar82._4_4_ =
               auVar52._4_4_ * values[0].ref.ptr._4_4_ +
               auVar55._4_4_ * blower0.lower.field_0.m128[1];
          auVar82._8_4_ =
               auVar52._8_4_ * (float)values[0]._8_4_ +
               auVar55._8_4_ * blower0.lower.field_0.m128[2];
          auVar82._12_4_ =
               auVar52._12_4_ * (float)values[0]._12_4_ +
               auVar55._12_4_ * blower0.lower.field_0.m128[3];
          auVar87._0_4_ =
               auVar52._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               auVar55._0_4_ * blower0.upper.field_0._0_4_;
          auVar87._4_4_ =
               auVar52._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               auVar55._4_4_ * blower0.upper.field_0._4_4_;
          auVar87._8_4_ =
               auVar52._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               auVar55._8_4_ * blower0.upper.field_0._8_4_;
          auVar87._12_4_ =
               auVar52._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar55._12_4_ * blower0.upper.field_0._12_4_;
          auVar55 = vmaxss_avx(ZEXT416((uint)((float)local_1de8._0_4_ - (float)local_1e08._0_4_)),
                               ZEXT816(0) << 0x40);
          auVar52 = vshufps_avx(auVar55,auVar55,0);
          auVar55 = ZEXT416((uint)(1.0 - auVar55._0_4_));
          auVar55 = vshufps_avx(auVar55,auVar55,0);
          aVar69._0_4_ = auVar55._0_4_ * (float)values[0].ref.ptr +
                         auVar52._0_4_ * blower0.lower.field_0.m128[0];
          aVar69._4_4_ = auVar55._4_4_ * values[0].ref.ptr._4_4_ +
                         auVar52._4_4_ * blower0.lower.field_0.m128[1];
          aVar69._8_4_ = auVar55._8_4_ * (float)values[0]._8_4_ +
                         auVar52._8_4_ * blower0.lower.field_0.m128[2];
          aVar69._12_4_ =
               auVar55._12_4_ * (float)values[0]._12_4_ +
               auVar52._12_4_ * blower0.lower.field_0.m128[3];
          aVar77._0_4_ = auVar55._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
                         auVar52._0_4_ * blower0.upper.field_0._0_4_;
          aVar77._4_4_ = auVar55._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
                         auVar52._4_4_ * blower0.upper.field_0._4_4_;
          aVar77._8_4_ = auVar55._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
                         auVar52._8_4_ * blower0.upper.field_0._8_4_;
          aVar77._12_4_ =
               auVar55._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar52._12_4_ * blower0.upper.field_0._12_4_;
          BVar44 = local_1e38;
        }
        else {
          bupper0.lower.field_0.m128[3] = (float)(iVar31 + 1);
          bupper0.lower.field_0._0_8_ = pGVar9->userPtr;
          bupper0.lower.field_0._8_4_ = fVar78;
          bupper0.upper.field_0._0_8_ = &blower1;
          (**(code **)&pGVar9->field_0x58)(&bupper0);
          bi.lower.field_0.m128[3] = (float)(local_1df8._0_4_ + -1);
          bi.lower.field_0.m128[0] = SUB84(pGVar9->userPtr,0);
          bi.lower.field_0.m128[1] = (float)((ulong)pGVar9->userPtr >> 0x20);
          bi.lower.field_0._8_4_ = fVar78;
          bi.upper.field_0._0_8_ = &bupper0;
          (**(code **)&pGVar9->field_0x58)(&bi);
          BVar44 = local_1e38;
          auVar55 = vmaxss_avx(ZEXT416((uint)fVar85),ZEXT816(0) << 0x40);
          auVar52 = vshufps_avx(auVar55,auVar55,0);
          auVar55 = ZEXT416((uint)(1.0 - auVar55._0_4_));
          auVar55 = vshufps_avx(auVar55,auVar55,0);
          auVar82._0_4_ =
               auVar52._0_4_ * blower1.lower.field_0.m128[0] +
               auVar55._0_4_ * blower0.lower.field_0.m128[0];
          auVar82._4_4_ =
               auVar52._4_4_ * blower1.lower.field_0.m128[1] +
               auVar55._4_4_ * blower0.lower.field_0.m128[1];
          auVar82._8_4_ =
               auVar52._8_4_ * blower1.lower.field_0.m128[2] +
               auVar55._8_4_ * blower0.lower.field_0.m128[2];
          auVar82._12_4_ =
               auVar52._12_4_ * blower1.lower.field_0.m128[3] +
               auVar55._12_4_ * blower0.lower.field_0.m128[3];
          auVar87._0_4_ =
               auVar52._0_4_ * blower1.upper.field_0.m128[0] +
               auVar55._0_4_ * blower0.upper.field_0.m128[0];
          auVar87._4_4_ =
               auVar52._4_4_ * blower1.upper.field_0.m128[1] +
               auVar55._4_4_ * blower0.upper.field_0.m128[1];
          auVar87._8_4_ =
               auVar52._8_4_ * blower1.upper.field_0.m128[2] +
               auVar55._8_4_ * blower0.upper.field_0.m128[2];
          auVar87._12_4_ =
               auVar52._12_4_ * blower1.upper.field_0.m128[3] +
               auVar55._12_4_ * blower0.upper.field_0.m128[3];
          auVar55 = vmaxss_avx(ZEXT416((uint)((float)local_1de8._0_4_ - (float)local_1e08._0_4_)),
                               ZEXT816(0) << 0x40);
          auVar52 = vshufps_avx(auVar55,auVar55,0);
          auVar55 = ZEXT416((uint)(1.0 - auVar55._0_4_));
          auVar55 = vshufps_avx(auVar55,auVar55,0);
          aVar69._0_4_ = auVar52._0_4_ * bupper0.lower.field_0.m128[0] +
                         auVar55._0_4_ * (float)values[0].ref.ptr;
          aVar69._4_4_ = auVar52._4_4_ * bupper0.lower.field_0.m128[1] +
                         auVar55._4_4_ * values[0].ref.ptr._4_4_;
          aVar69._8_4_ = auVar52._8_4_ * bupper0.lower.field_0.m128[2] +
                         auVar55._8_4_ * (float)values[0]._8_4_;
          aVar69._12_4_ =
               auVar52._12_4_ * bupper0.lower.field_0.m128[3] +
               auVar55._12_4_ * (float)values[0]._12_4_;
          aVar77._0_4_ = auVar52._0_4_ * bupper0.upper.field_0.m128[0] +
                         auVar55._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
          aVar77._4_4_ = auVar52._4_4_ * bupper0.upper.field_0.m128[1] +
                         auVar55._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
          aVar77._8_4_ = auVar52._8_4_ * bupper0.upper.field_0.m128[2] +
                         auVar55._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
          aVar77._12_4_ =
               auVar52._12_4_ * bupper0.upper.field_0.m128[3] +
               auVar55._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
          iVar46 = iVar46 + 1;
          if (iVar46 < iVar10) {
            local_1e10 = (size_t *)CONCAT44(local_1e10._4_4_,local_1e10._0_4_ - local_1dc0._0_4_);
            do {
              auVar56._0_4_ =
                   ((float)iVar46 / local_1dc8._0_4_ - local_1dc0._0_4_) / local_1e10._0_4_;
              auVar56._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar55 = vshufps_avx(auVar56,auVar56,0);
              local_1e08._0_4_ = aVar69.m128[0];
              local_1e08._4_4_ = aVar69.m128[1];
              uStack_1e00._0_4_ = aVar69.m128[2];
              uStack_1e00._4_4_ = aVar69.m128[3];
              auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - auVar56._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar56._0_4_)),0);
              local_1df8.m128[0] =
                   auVar55._0_4_ * (float)local_1e08._0_4_ + auVar82._0_4_ * auVar52._0_4_;
              local_1df8._4_4_ =
                   auVar55._4_4_ * (float)local_1e08._4_4_ + auVar82._4_4_ * auVar52._4_4_;
              local_1df8._8_4_ = auVar55._8_4_ * (float)uStack_1e00 + auVar82._8_4_ * auVar52._8_4_;
              local_1df8._12_4_ =
                   auVar55._12_4_ * uStack_1e00._4_4_ + auVar82._12_4_ * auVar52._12_4_;
              fVar90 = auVar87._4_4_;
              fVar91 = auVar87._8_4_;
              fVar85 = auVar87._12_4_;
              auVar57._0_4_ = aVar77.m128[0] * auVar55._0_4_ + auVar87._0_4_ * auVar52._0_4_;
              auVar57._4_4_ = aVar77.m128[1] * auVar55._4_4_ + fVar90 * auVar52._4_4_;
              auVar57._8_4_ = aVar77.m128[2] * auVar55._8_4_ + fVar91 * auVar52._8_4_;
              auVar57._12_4_ = aVar77.m128[3] * auVar55._12_4_ + fVar85 * auVar52._12_4_;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_ = pGVar9->userPtr;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              m128[3] = (float)iVar46;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              m128[2] = fVar78;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
              _0_8_ = &bi;
              _local_1e28 = aVar77;
              _local_1e08 = aVar69;
              _local_1de8 = auVar82;
              (**(code **)&pGVar9->field_0x58)(&right);
              auVar13._4_4_ = bi.lower.field_0.m128[1];
              auVar13._0_4_ = bi.lower.field_0.m128[0];
              auVar13._8_4_ = bi.lower.field_0.m128[2];
              auVar13._12_4_ = bi.lower.field_0.m128[3];
              auVar55 = vsubps_avx(auVar13,(undefined1  [16])local_1df8);
              auVar14._8_4_ = bi.upper.field_0.m128[2];
              auVar14._0_8_ = bi.upper.field_0._0_8_;
              auVar14._12_4_ = bi.upper.field_0.m128[3];
              auVar51 = vsubps_avx(auVar14,auVar57);
              auVar52 = vminps_avx(auVar55,ZEXT816(0) << 0x40);
              auVar55 = vmaxps_avx(auVar51,ZEXT816(0) << 0x40);
              auVar82._0_4_ = (float)local_1de8._0_4_ + auVar52._0_4_;
              auVar82._4_4_ = (float)local_1de8._4_4_ + auVar52._4_4_;
              auVar82._8_4_ = (float)uStack_1de0 + auVar52._8_4_;
              auVar82._12_4_ = uStack_1de0._4_4_ + auVar52._12_4_;
              aVar69._0_4_ = (float)local_1e08._0_4_ + auVar52._0_4_;
              aVar69._4_4_ = (float)local_1e08._4_4_ + auVar52._4_4_;
              aVar69._8_4_ = (float)uStack_1e00 + auVar52._8_4_;
              aVar69._12_4_ = uStack_1e00._4_4_ + auVar52._12_4_;
              auVar87._0_4_ = auVar87._0_4_ + auVar55._0_4_;
              auVar87._4_4_ = fVar90 + auVar55._4_4_;
              auVar87._8_4_ = fVar91 + auVar55._8_4_;
              auVar87._12_4_ = fVar85 + auVar55._12_4_;
              aVar77._0_4_ = (float)local_1e28._0_4_ + auVar55._0_4_;
              aVar77._4_4_ = (float)local_1e28._4_4_ + auVar55._4_4_;
              aVar77._8_4_ = fStack_1e20 + auVar55._8_4_;
              aVar77._12_4_ = fStack_1e1c + auVar55._12_4_;
              iVar46 = iVar46 + 1;
            } while (iVar10 != iVar46);
          }
        }
        aVar63.m128 = (__m128)vmaxps_avx(aVar63.m128,aVar77.m128);
        local_1a38.m128 = (__m128)vminps_avx(local_1a38.m128,aVar69.m128);
        aVar68.m128 = (__m128)vmaxps_avx(aVar68.m128,auVar87);
        local_1a48.m128 = (__m128)vminps_avx(local_1a48.m128,auVar82);
        BVar44 = (BBox1f)((long)BVar44 + 1);
        uVar42 = uVar42 + 1;
        this = local_1e30;
      } while (uVar42 != local_1dd0);
    }
    (local_1e18->ref).ptr = uVar39 | (ulong)pcVar38 | 8;
    (local_1e18->lbounds).bounds0.lower.field_0 = local_1a48;
    (local_1e18->lbounds).bounds0.upper.field_0 = aVar68;
    (local_1e18->lbounds).bounds1.lower.field_0 = local_1a38;
    (local_1e18->lbounds).bounds1.upper.field_0 = aVar63;
    local_1e18->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return local_1e18;
  }
  lVar32 = 0xbc;
  do {
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar32 + 4) = 0xffffffff7f800000;
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar32 + 0xc) = 0;
    lVar32 = lVar32 + 0xf0;
  } while (lVar32 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  blower0.upper.field_0 = _local_1e08;
  local_17a8._0_8_ = local_1de8;
  local_17a8._8_8_ = uStack_1de0;
  local_1788.m128 = _local_1e28;
  local_1778.m128 = local_1df8.m128;
  local_1758[0] = local_1e38;
  local_1758[1] = BVar33;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar37;
  local_1718[0].mapping.scale.field_0 = local_1798;
  local_840 = BVar37;
  local_838[0] = 2;
  local_8c8[0] = &local_840;
  local_1e28 = (undefined1  [8])local_1b78;
  local_1df8._0_8_ = &local_1a88;
  local_1dc8 = &ppTStack_1ba8;
  local_1e10 = &sStack_1ab8;
  uStack_1de0._0_4_ = INFINITY;
  local_1de8 = (undefined1  [8])0x7f8000007f800000;
  uStack_1de0._4_4_ = INFINITY;
  uStack_1e00._0_4_ = -INFINITY;
  local_1e08 = (undefined1  [8])0xff800000ff800000;
  uStack_1e00._4_4_ = -INFINITY;
  bVar43 = 0;
  uVar41 = local_1e38;
  local_1e38 = (BBox1f)&this->heuristicTemporalSplit;
  blower0.lower.field_0._0_8_ = uVar39;
  local_1798.v = aVar63.m128;
  local_1768 = (undefined1  [16])aVar68;
  do {
    if (local_848 == 0) goto LAB_0133f54e;
    lVar32 = -1;
    pBVar36 = local_1758;
    uVar39 = 0;
    uVar41 = 0;
    do {
      uVar42 = (long)pBVar36[1] - (long)*pBVar36;
      if ((((local_1e30->cfg).maxLeafSize < uVar42) || (1 < (uint)pBVar36[9].upper)) ||
         (bVar40 != 0)) {
        if (uVar39 < uVar42) {
          lVar32 = uVar41;
          uVar39 = uVar42;
        }
        bVar40 = 0;
      }
      uVar41 = uVar41 + 1;
      pBVar36 = pBVar36 + 0x1e;
    } while (local_848 != uVar41);
    if (lVar32 == -1) goto LAB_0133f504;
    lVar23 = lVar32 * 0xf0;
    local_1e58._0_8_ = (task_group_context *)((long)&blower0 + lVar23);
    blower1.lower.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    local_1b78[0] = 0xffffffff7f800000;
    local_1b78[1] = 0;
    local_1a88 = 0xffffffff7f800000;
    uStack_1a80 = 0;
    local_1dc0 = (Split *)((long)local_1718 + lVar32 * 0xf0);
    iVar46 = *(int *)((long)local_1718 + lVar32 * 0xf0 + 0xc);
    bupper0.lower.field_0._0_8_ = blower1.lower.field_0._0_8_;
    if (iVar46 == 0) {
      local_1bb8 = local_1758[lVar32 * 0x1e];
      BStack_1ac0 = local_1758[lVar32 * 0x1e + 1];
      bi.lower.field_0.m128[0] = INFINITY;
      bi.lower.field_0.m128[1] = INFINITY;
      bi.lower.field_0.m128[2] = INFINITY;
      bi.lower.field_0.m128[3] = INFINITY;
      bi.upper.field_0.m128[0] = -INFINITY;
      bi.upper.field_0.m128[1] = -INFINITY;
      bi.upper.field_0.m128[2] = -INFINITY;
      bi.upper.field_0.m128[3] = -INFINITY;
      local_1cb8.m128[0] = INFINITY;
      local_1cb8.m128[1] = INFINITY;
      local_1cb8.m128[2] = INFINITY;
      local_1cb8.m128[3] = INFINITY;
      aStack_1ca8.m128[0] = -INFINITY;
      aStack_1ca8.m128[1] = -INFINITY;
      aStack_1ca8.m128[2] = -INFINITY;
      aStack_1ca8.m128[3] = -INFINITY;
      local_1c98.m128[0] = INFINITY;
      local_1c98.m128[1] = INFINITY;
      local_1c98.m128[2] = INFINITY;
      local_1c98.m128[3] = INFINITY;
      aStack_1c88.m128[0] = -INFINITY;
      aStack_1c88.m128[1] = -INFINITY;
      aStack_1c88.m128[2] = -INFINITY;
      aStack_1c88.m128[3] = -INFINITY;
      local_1c58 = 0.0;
      local_1c78.lower = 0.0;
      local_1c78.upper = 0.0;
      BStack_1c70.lower = 0.0;
      BStack_1c70.upper = 0.0;
      ppTStack_1c68 = (pointer)0x0;
      ppTStack_1c60 = (pointer)0x0;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      lVar26 = vmovlps_avx(auVar71);
      fStack_1c54 = (float)lVar26;
      fStack_1c50 = (float)((ulong)lVar26 >> 0x20);
      fStack_1c4c = 0.0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.max_time_range.lower = 0.0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      uVar41 = vmovlps_avx(auVar71);
      right.max_time_range.upper = (float)uVar41;
      right.time_range.lower = (float)((ulong)uVar41 >> 0x20);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar32 * 0xf0 + 8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar24 = (long)(1 << (*(byte *)((long)local_1718 + lVar23 + 4) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar24);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar24 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      isLeft.split = local_1dc0;
      BStack_1bb0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                      (*(PrimRefMB **)((long)local_1728[lVar32 * 0x1e] + 0x20),
                                       (size_t)local_1bb8,(size_t)BStack_1ac0,(EmptyTy *)local_19d8,
                                       (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right,
                                       &isLeft,&reduction,&reduction2,0x80,0xc00);
      BVar33 = local_1728[lVar32 * 0x1e];
      auVar50._8_8_ = 0;
      auVar50._0_4_ = local_1728[lVar32 * 0x1e + -1].lower;
      auVar50._4_4_ = local_1728[lVar32 * 0x1e + -1].upper;
      auStack_1c08._0_8_ = CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
      auStack_1c08._8_8_ = CONCAT44(bi.upper.field_0.m128[3],bi.upper.field_0.m128[2]);
      local_1bf8._0_8_ = 0x7f8000007f800000;
      local_1bf8._8_8_ = 0x7f8000007f800000;
      aStack_1be8._0_8_ = 0xff800000ff800000;
      aStack_1be8._8_8_ = 0xff800000ff800000;
      local_1bd8.lower = INFINITY;
      local_1bd8.upper = INFINITY;
      sStack_1bd0 = 0x7f8000007f800000;
      sStack_1bc8 = 0xff800000ff800000;
      BStack_1bc0.lower = -INFINITY;
      BStack_1bc0.upper = -INFINITY;
      blower1.upper.field_0.m128[0] = bi.lower.field_0.m128[0];
      blower1.upper.field_0.m128[1] = bi.lower.field_0.m128[1];
      blower1.upper.field_0.m128[2] = bi.lower.field_0.m128[2];
      blower1.upper.field_0.m128[3] = bi.lower.field_0.m128[3];
      *local_1dc8 = (pointer)0x0;
      local_1dc8[1] = (pointer)0x0;
      local_1dc8[2] = (pointer)(lVar26 << 0x20);
      local_1dc8[3] = (pointer)(ulong)(uint)fStack_1c50;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = auStack_1b98._8_8_;
      auVar55 = vcmpps_avx(auVar59,auVar50,1);
      auVar52 = vinsertps_avx(auVar50,auVar59,0x50);
      auVar51 = vinsertps_avx(auVar59,auVar50,0x50);
      auVar55 = vblendvps_avx(auVar51,auVar52,auVar55);
      uVar41 = vmovlps_avx(auVar55);
      auStack_1b98._8_8_ = uVar41;
      bupper0.upper.field_0._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      bupper0.upper.field_0._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      uStack_1b10 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[2]);
      uStack_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._0_8_;
      local_1b08 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[0]);
      uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[2]);
      uStack_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[0]);
      uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[2]);
      local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[0]);
      uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[2]);
      *local_1e10 = right.num_time_segments;
      local_1e10[1] = right.max_num_time_segments;
      local_1e10[2] = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
      local_1e10[3] = CONCAT44(right.time_range.upper,right.time_range.lower);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = auStack_1aa8._8_8_;
      auVar55 = vcmpps_avx(auVar60,auVar50,1);
      auVar52 = vinsertps_avx(auVar50,auVar60,0x50);
      auVar51 = vinsertps_avx(auVar60,auVar50,0x50);
      auVar55 = vblendvps_avx(auVar51,auVar52,auVar55);
      uVar41 = vmovlps_avx(auVar55);
      auStack_1aa8._8_8_ = uVar41;
      local_1b88 = BVar33;
      local_1ac8 = BStack_1bb0;
      local_1a98 = BVar33;
LAB_0133e81f:
      local_1e40.lower = 0.0;
      local_1e40.upper = 0.0;
      bVar48 = false;
    }
    else {
      this_01 = (SetMB *)((long)&blower0 + lVar23 + 0x10);
      if (iVar46 != 2) {
        if (iVar46 == 1) {
          SetMB::deterministic_order(this_01);
          splitFallback(local_1e30,this_01,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
        }
        else if (iVar46 == 3) {
          SetMB::deterministic_order(this_01);
          splitByGeometry(local_1e30,this_01,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
        }
        goto LAB_0133e81f;
      }
      time_range1.lower = *(float *)((long)local_1718 + lVar32 * 0xf0 + 8);
      time_range0.lower = local_1728[lVar32 * 0x1e + -1].lower;
      time_range1.upper = local_1728[lVar32 * 0x1e + -1].upper;
      BVar33 = local_1728[lVar32 * 0x1e];
      time_range0.upper = time_range1.lower;
      BVar25 = (BBox1f)operator_new(0x28);
      pMVar4 = *(MemoryMonitorInterface **)local_1e38;
      BVar37 = local_1758[lVar32 * 0x1e + 1];
      *(MemoryMonitorInterface **)BVar25 = pMVar4;
      *(undefined1 *)((long)BVar25 + 8) = 0;
      *(long *)((long)BVar25 + 0x10) = 0;
      *(long *)((long)BVar25 + 0x18) = 0;
      *(long *)((long)BVar25 + 0x20) = 0;
      lVar26 = (long)BVar37 - (long)local_1758[lVar32 * 0x1e];
      BVar44 = BVar37;
      if (lVar26 != 0) {
        local_1a48._0_8_ = lVar26;
        uVar39 = lVar26 * 0x50;
        (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,uVar39,0);
        if (uVar39 < 0x1c00000) {
          pvVar27 = alignedMalloc(uVar39,0x10);
        }
        else {
          pvVar27 = os_malloc(uVar39,(bool *)((long)BVar25 + 8));
        }
        *(void **)((long)BVar25 + 0x20) = pvVar27;
        *(undefined8 *)((long)BVar25 + 0x10) = local_1a48._0_8_;
        *(undefined8 *)((long)BVar25 + 0x18) = local_1a48._0_8_;
        BVar37 = local_1758[lVar32 * 0x1e];
        BVar44 = local_1758[lVar32 * 0x1e + 1];
      }
      pvVar19 = isLeft.vSplitPos;
      vSplitMask.field_0._8_8_ = &time_range0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.max_time_range.lower = 0.0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      auVar55._8_4_ = 0x3f800000;
      auVar55._0_8_ = 0x3f8000003f800000;
      auVar55._12_4_ = 0x3f800000;
      uVar41 = vmovlps_avx(auVar55);
      right.max_time_range.upper = (float)uVar41;
      right.time_range.lower = (float)((ulong)uVar41 >> 0x20);
      right.time_range.upper = 0.0;
      local_1e40 = BVar25;
      vSplitMask.field_0._0_8_ = BVar33;
      if ((ulong)((long)BVar44 - (long)BVar37) < 0xc00) {
        isLeft.split = (Split *)BVar37;
        isLeft.vSplitPos = (vint *)BVar44;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&bi,(anon_class_40_5_808acc65 *)&vSplitMask,
                   (range<unsigned_long> *)&isLeft);
      }
      else {
        isLeft.vSplitPos._6_2_ = SUB82(pvVar19,6);
        isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
        tbb::detail::r1::initialize((task_group_context *)&isLeft);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)BVar44;
        vSplitPos.field_0.v[1] = (longlong)BVar37;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMB *)&bi,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,local_1e58._0_8_);
        cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar22 != '\0') {
          prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar30,"task cancelled");
          __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&isLeft);
      }
      BVar37 = local_1758[lVar32 * 0x1e];
      BVar44 = local_1758[lVar32 * 0x1e + 1];
      uVar39 = (long)BVar44 - (long)BVar37;
      if ((long)BStack_1c70 - (long)local_1c78 != uVar39) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = &time_range0;
        BStack_1c70 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                        (*(PrimRefMB **)((long)BVar25 + 0x20),0,uVar39,0x400,
                                         (anon_class_8_1_41ce32a5 *)&right);
        BVar37 = local_1758[lVar32 * 0x1e];
        BVar44 = local_1758[lVar32 * 0x1e + 1];
        uVar39 = (long)BVar44 - (long)BVar37;
      }
      auVar51._4_4_ = time_range0.upper;
      auVar51._0_4_ = time_range0.lower;
      auVar51._8_8_ = 0;
      auStack_1c08._0_8_ = CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
      auStack_1c08._8_8_ = CONCAT44(bi.upper.field_0.m128[3],bi.upper.field_0.m128[2]);
      local_1bf8._0_8_ = CONCAT44(local_1cb8.m128[1],local_1cb8.m128[0]);
      local_1bf8._8_8_ = CONCAT44(local_1cb8.m128[3],local_1cb8.m128[2]);
      aStack_1be8._0_8_ = CONCAT44(aStack_1ca8.m128[1],aStack_1ca8.m128[0]);
      aStack_1be8._8_8_ = CONCAT44(aStack_1ca8.m128[3],aStack_1ca8.m128[2]);
      local_1bd8.upper = local_1c98.m128[1];
      local_1bd8.lower = local_1c98.m128[0];
      sStack_1bd0 = CONCAT44(local_1c98.m128[3],local_1c98.m128[2]);
      sStack_1bc8 = CONCAT44(aStack_1c88.m128[1],aStack_1c88.m128[0]);
      BStack_1bc0.upper = aStack_1c88.m128[3];
      BStack_1bc0.lower = aStack_1c88.m128[2];
      *local_1dc8 = ppTStack_1c68;
      local_1dc8[1] = ppTStack_1c60;
      uVar41 = vSplitPos.field_0.v[1];
      blower1.upper.field_0.m128[0] = bi.lower.field_0.m128[0];
      blower1.upper.field_0.m128[1] = bi.lower.field_0.m128[1];
      blower1.upper.field_0.m128[2] = bi.lower.field_0.m128[2];
      blower1.upper.field_0.m128[3] = bi.lower.field_0.m128[3];
      local_1bb8 = local_1c78;
      auVar61._4_4_ = fStack_1c54;
      auVar61._0_4_ = local_1c58;
      auVar61._8_8_ = 0;
      auVar65._4_4_ = fStack_1c4c;
      auVar65._0_4_ = fStack_1c50;
      auVar65._8_8_ = 0;
      auVar55 = vcmpps_avx(auVar65,auVar51,1);
      auVar52 = vinsertps_avx(auVar51,auVar65,0x50);
      auVar51 = vinsertps_avx(auVar65,auVar51,0x50);
      auVar55 = vblendvps_avx(auVar51,auVar52,auVar55);
      auStack_1b98 = vmovlhps_avx(auVar61,auVar55);
      isLeft.split = (Split *)0x7f8000007f800000;
      isLeft.vSplitPos = (vint *)0x7f8000007f800000;
      isLeft.vSplitMask = (vbool *)0xff800000ff800000;
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      vmovlps_avx(auVar52);
      local_1b88 = BVar25;
      _reduction2 = BVar33;
      if (uVar39 < 0xc00) {
        vSplitPos.field_0.v[0] = (longlong)BVar37;
        vSplitPos.field_0.v[1] = (longlong)BVar44;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  (&right,(anon_class_24_3_35f68c7c *)&reduction2,(range<unsigned_long> *)&vSplitPos
                  );
      }
      else {
        vSplitPos.field_0.v[1]._4_1_ = 1;
        vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar41,6);
        vSplitPos.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
        local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19d8._8_8_ = &reduction2;
        _reduction = (code *)BVar44;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,local_1e58._0_8_);
        cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar22 != '\0') {
          prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar30,"task cancelled");
          __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
      }
      lVar26 = right.object_range._end - right.object_range._begin;
      right.object_range._begin = *(unsigned_long *)(local_1758 + lVar32 * 0x1e);
      right.object_range._end = lVar26 + right.object_range._begin;
      if (lVar26 != (long)local_1758[lVar32 * 0x1e + 1] - right.object_range._begin) {
        isLeft.split = (Split *)&time_range1;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       (*(PrimRefMB **)((long)BVar33 + 0x20),right.object_range._begin,
                        (unsigned_long)local_1758[lVar32 * 0x1e + 1],0x400,
                        (anon_class_8_1_41ce32a6 *)&isLeft);
      }
      auVar53._4_4_ = time_range1.upper;
      auVar53._0_4_ = time_range1.lower;
      auVar53._8_8_ = 0;
      bupper0.upper.field_0._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      bupper0.upper.field_0._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      uStack_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._0_8_;
      uStack_1b10 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[2]);
      local_1b08 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[0]);
      uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[2]);
      uStack_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[0]);
      uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[2]);
      local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[0]);
      uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[2]);
      *local_1e10 = right.num_time_segments;
      local_1e10[1] = right.max_num_time_segments;
      auVar62._4_4_ = right.max_time_range.upper;
      auVar62._0_4_ = right.max_time_range.lower;
      auVar62._8_8_ = 0;
      auVar66._4_4_ = right.time_range.upper;
      auVar66._0_4_ = right.time_range.lower;
      auVar66._8_8_ = 0;
      auVar55 = vcmpps_avx(auVar66,auVar53,1);
      auVar52 = vinsertps_avx(auVar53,auVar66,0x50);
      auVar51 = vinsertps_avx(auVar66,auVar53,0x50);
      auVar55 = vblendvps_avx(auVar51,auVar52,auVar55);
      auStack_1aa8 = vmovlhps_avx(auVar62,auVar55);
      bVar48 = local_1e40 != (BBox1f)0x0;
      BStack_1bb0 = BStack_1c70;
      local_1ac8 = (BBox1f)right.object_range._begin;
      BStack_1ac0 = (BBox1f)right.object_range._end;
      local_1a98 = BVar33;
    }
    this_00 = local_1e30;
    uVar41 = &bi;
    findFallback((Split *)uVar41,local_1e30,(SetMB *)&blower1.upper);
    *(ulong *)local_1e28 = CONCAT44(bi.lower.field_0.m128[1],bi.lower.field_0.m128[0]);
    *(ulong *)((long)local_1e28 + 8) = CONCAT44(bi.lower.field_0.m128[3],bi.lower.field_0.m128[2]);
    local_1b78[2] = CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
    local_1b58 = (BBox1f *)CONCAT44(local_1cb8.m128[1],local_1cb8.m128[0]);
    uStack_1b50 = CONCAT44(local_1cb8.m128[3],local_1cb8.m128[2]);
    uStack_1b48 = CONCAT44(aStack_1ca8.m128[1],aStack_1ca8.m128[0]);
    uStack_1b40 = CONCAT44(aStack_1ca8.m128[3],aStack_1ca8.m128[2]);
    findFallback((Split *)uVar41,this_00,(SetMB *)&bupper0.upper);
    lVar26 = local_640;
    *(ulong *)local_1df8._0_8_ = CONCAT44(bi.lower.field_0.m128[1],bi.lower.field_0.m128[0]);
    *(ulong *)(local_1df8._0_8_ + 8) = CONCAT44(bi.lower.field_0.m128[3],bi.lower.field_0.m128[2]);
    local_1a78 = CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
    local_1a68 = (BBox1f *)CONCAT44(local_1cb8.m128[1],local_1cb8.m128[0]);
    uStack_1a60 = CONCAT44(local_1cb8.m128[3],local_1cb8.m128[2]);
    uStack_1a58 = CONCAT44(aStack_1ca8.m128[1],aStack_1ca8.m128[0]);
    uStack_1a50 = CONCAT44(aStack_1ca8.m128[3],aStack_1ca8.m128[2]);
    local_1e40 = (BBox1f)0x0;
    pBVar36 = local_8c8[lVar32];
    if (local_1b88 == *pBVar36) {
      pBVar36[1] = (BBox1f)((long)pBVar36[1] + 1);
      BVar33 = local_1b88;
    }
    else {
      local_640 = local_640 + 1;
      uVar41 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar41 + 0x78) + (lVar26 * 2 + -0xf) * 8) = local_1b88;
      local_838[lVar26 * 2] = 1;
      local_8c8[lVar32] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar41 + 0x78) + (lVar26 * 2 + -0xf) * 8);
      BVar33 = *pBVar36;
    }
    lVar26 = local_640;
    if (local_1a98 == BVar33) {
      local_8c8[local_848] = pBVar36;
      BVar33 = pBVar36[1];
      pBVar36[1] = (BBox1f)((long)BVar33 + 1);
    }
    else {
      local_640 = local_640 + 1;
      uVar41 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar41 + 0x78) + (lVar26 * 2 + -0xf) * 8) = local_1a98;
      local_838[lVar26 * 2] = 1;
      local_8c8[local_848] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar41 + 0x78) + (lVar26 * 2 + -0xf) * 8);
      BVar33 = (BBox1f)((long)pBVar36[1] + -1);
    }
    pBVar36[1] = BVar33;
    if (BVar33 == (BBox1f)0x0) {
      uVar41 = *pBVar36;
      if ((BBox1f)uVar41 != (BBox1f)0x0) {
        lVar26 = *(long *)(uVar41 + 0x18);
        pvVar27 = *(void **)(uVar41 + 0x20);
        if (pvVar27 != (void *)0x0) {
          if ((ulong)(lVar26 * 0x50) < 0x1c00000) {
            alignedFree(pvVar27);
          }
          else {
            os_free(pvVar27,lVar26 * 0x50,
                    (bool)((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                            *)(uVar41 + 8))->field_0x0);
          }
        }
        if (lVar26 != 0) {
          (**(code **)**(undefined8 **)uVar41)(*(undefined8 **)uVar41,lVar26 * -0x50,1);
        }
        *(undefined8 *)(uVar41 + 0x10) = 0;
        *(undefined8 *)(uVar41 + 0x18) = 0;
        *(undefined8 *)(uVar41 + 0x20) = 0;
      }
      operator_delete((void *)uVar41);
    }
    auVar52 = auStack_1aa8;
    auVar55 = auStack_1b98;
    (local_1e58._0_8_)->my_cpu_ctl_env = blower1.lower.field_0._0_8_;
    *(ulong *)((long)&blower0 + lVar23 + 0x10) =
         CONCAT44(blower1.upper.field_0.m128[1],blower1.upper.field_0.m128[0]);
    *(ulong *)((long)&blower0 + lVar23 + 0x18) =
         CONCAT44(blower1.upper.field_0.m128[3],blower1.upper.field_0.m128[2]);
    *(undefined8 *)(&local_17a8 + lVar32 * 0xf) = auStack_1c08._0_8_;
    *(undefined8 *)((long)&local_17a8 + lVar23 + 8) = auStack_1c08._8_8_;
    *(undefined8 *)((long)&local_1798 + lVar32 * 0xf0) = local_1bf8._0_8_;
    *(undefined8 *)((long)&local_1798 + lVar32 * 0xf0U + 8U) = local_1bf8._8_8_;
    *(undefined8 *)(&local_1788 + lVar32 * 0xf) = aStack_1be8._0_8_;
    *(undefined8 *)((long)&local_1788 + lVar23 + 8) = aStack_1be8._8_8_;
    *(BBox1f *)((long)&local_1778 + lVar32 * 0xf0) = local_1bd8;
    *(size_t *)(local_1768 + lVar23 + -8) = sStack_1bd0;
    *(size_t *)(local_1768 + lVar32 * 0xf0) = sStack_1bc8;
    *(BBox1f *)(local_1768 + lVar23 + 8) = BStack_1bc0;
    local_1758[lVar32 * 0x1e] = local_1bb8;
    local_1758[lVar32 * 0x1e + 1] = BStack_1bb0;
    asStack_1748[lVar32 * 0x1e] = (size_t)ppTStack_1ba8;
    asStack_1748[lVar32 * 0x1e + 1] = sStack_1ba0;
    (&local_1738)[lVar32 * 0x1e].lower = (float)auStack_1b98._0_4_;
    (&local_1738)[lVar32 * 0x1e].upper = (float)auStack_1b98._4_4_;
    local_1728[lVar32 * 0x1e + -1].lower = (float)auStack_1b98._8_4_;
    local_1728[lVar32 * 0x1e + -1].upper = (float)auStack_1b98._12_4_;
    local_1728[lVar32 * 0x1e] = local_1b88;
    uVar11 = *(undefined8 *)local_1e28;
    uVar12 = *(undefined8 *)((long)local_1e28 + 8);
    local_1dc0->sah = (float)(int)uVar11;
    local_1dc0->dim = (int)((ulong)uVar11 >> 0x20);
    local_1dc0->field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)(int)uVar12;
    uVar39 = local_848;
    local_1dc0->data = (int)((ulong)uVar12 >> 0x20);
    *(size_t *)((long)local_1718 + lVar32 * 0xf0 + 0x10) = local_1b78[2];
    local_8c8[lVar32 * 0x1e + -0x1c6] = local_1b58;
    *(undefined8 *)((long)local_1718 + (lVar32 * 0xf + -1) * 0x10 + 0x38) = uStack_1b50;
    *(undefined8 *)((long)local_1718 + lVar32 * 0xf0 + 0x30) = uStack_1b48;
    *(undefined8 *)((long)local_1718 + lVar32 * 0xf0 + 0x38) = uStack_1b40;
    lVar32 = local_848 * 0xf0;
    *(undefined8 *)((long)&blower0 + lVar32) = bupper0.lower.field_0._0_8_;
    *(undefined8 *)((long)&blower0 + lVar32 + 0x10) = bupper0.upper.field_0._0_8_;
    *(undefined8 *)((long)&blower0 + lVar32 + 0x18) = bupper0.upper.field_0._8_8_;
    *(undefined8 *)(&local_17a8 + uVar39 * 0xf) = uStack_1b18;
    *(undefined8 *)((long)&local_17a8 + lVar32 + 8) = uStack_1b10;
    *(undefined8 *)((long)&local_1798 + uVar39 * 0xf0) = local_1b08;
    *(undefined8 *)((long)&local_1798 + uVar39 * 0xf0 + 8) = uStack_1b00;
    *(undefined8 *)(&local_1788 + uVar39 * 0xf) = uStack_1af8;
    *(undefined8 *)((long)&local_1788 + lVar32 + 8) = uStack_1af0;
    *(undefined8 *)((long)&local_1778 + uVar39 * 0xf0) = local_1ae8;
    *(undefined8 *)(local_1768 + lVar32 + -8) = uStack_1ae0;
    *(undefined8 *)(local_1768 + uVar39 * 0xf0) = uStack_1ad8;
    *(undefined8 *)(local_1768 + lVar32 + 8) = uStack_1ad0;
    local_1758[uVar39 * 0x1e] = local_1ac8;
    local_1758[uVar39 * 0x1e + 1] = BStack_1ac0;
    asStack_1748[uVar39 * 0x1e] = sStack_1ab8;
    asStack_1748[uVar39 * 0x1e + 1] = sStack_1ab0;
    (&local_1738)[uVar39 * 0x1e].lower = (float)auStack_1aa8._0_4_;
    (&local_1738)[uVar39 * 0x1e].upper = (float)auStack_1aa8._4_4_;
    local_1728[uVar39 * 0x1e + -1].lower = (float)auStack_1aa8._8_4_;
    local_1728[uVar39 * 0x1e + -1].upper = (float)auStack_1aa8._12_4_;
    local_1728[uVar39 * 0x1e] = local_1a98;
    uVar11 = *(undefined8 *)(local_1df8._0_8_ + 8);
    *(undefined8 *)((long)local_1718 + uVar39 * 0xf0) = *(undefined8 *)local_1df8._0_8_;
    *(undefined8 *)((long)local_1718 + uVar39 * 0xf0 + 8) = uVar11;
    *(undefined8 *)((long)local_1718 + uVar39 * 0xf0 + 0x10) = local_1a78;
    local_8c8[uVar39 * 0x1e + -0x1c6] = local_1a68;
    *(undefined8 *)((long)local_1718 + (uVar39 * 0xf + -1) * 0x10 + 0x38) = uStack_1a60;
    *(undefined8 *)((long)local_1718 + uVar39 * 0xf0 + 0x30) = uStack_1a58;
    *(undefined8 *)((long)local_1718 + uVar39 * 0xf0 + 0x38) = uStack_1a50;
    local_848 = local_848 + 1;
    auStack_1b98 = auVar55;
    auStack_1aa8 = auVar52;
    if (local_1e40 != (BBox1f)0x0) {
      uVar41 = &local_1e40;
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)uVar41,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1e40);
    }
    bVar43 = bVar43 | bVar48;
  } while (local_848 < (local_1e30->cfg).branchingFactor);
  if (local_848 != 0) {
LAB_0133f504:
    puVar34 = &uStack_172c;
    uVar39 = local_848;
    do {
      auVar55 = vcmpps_avx(ZEXT416(*(uint *)(local_1a38._0_8_ + 0x98)),ZEXT416(puVar34[-1]),1);
      auVar52 = vcmpps_avx(ZEXT416(*puVar34),ZEXT416(*(uint *)(local_1a38._0_8_ + 0x9c)),1);
      auVar55 = vorps_avx(auVar55,auVar52);
      bVar43 = bVar43 | auVar55[0];
      puVar34 = puVar34 + 0x3c;
      uVar39 = uVar39 - 1;
    } while (uVar39 != 0);
  }
LAB_0133f54e:
  pNVar45 = local_1e18;
  if ((bVar43 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar5 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar5->alloc)._M_b._M_p) {
      bupper0.lower.field_0._8_1_ = 1;
      bupper0.lower.field_0._0_8_ = pTVar5;
      MutexSys::lock(&pTVar5->mutex);
      if ((pTVar5->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar5->alloc1).bytesUsed + (pTVar5->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar5->alloc0).end + (pTVar5->alloc1).end) -
             ((pTVar5->alloc0).cur + (pTVar5->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar5->alloc1).bytesWasted + (pTVar5->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar5->alloc0).end = auVar58._0_8_;
      (pTVar5->alloc0).allocBlockSize = auVar58._8_8_;
      (pTVar5->alloc0).bytesUsed = auVar58._16_8_;
      (pTVar5->alloc0).bytesWasted = auVar58._24_8_;
      (pTVar5->alloc0).ptr = (char *)auVar58._0_8_;
      (pTVar5->alloc0).cur = auVar58._8_8_;
      (pTVar5->alloc0).end = auVar58._16_8_;
      (pTVar5->alloc0).allocBlockSize = auVar58._24_8_;
      auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar5->alloc1).end = auVar58._0_8_;
        (pTVar5->alloc1).allocBlockSize = auVar58._8_8_;
        (pTVar5->alloc1).bytesUsed = auVar58._16_8_;
        (pTVar5->alloc1).bytesWasted = auVar58._24_8_;
        (pTVar5->alloc1).ptr = (char *)auVar58._0_8_;
        (pTVar5->alloc1).cur = auVar58._8_8_;
        (pTVar5->alloc1).end = auVar58._16_8_;
        (pTVar5->alloc1).allocBlockSize = auVar58._24_8_;
      }
      else {
        (pTVar5->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar5->alloc1).ptr = (char *)auVar58._0_8_;
        (pTVar5->alloc1).cur = auVar58._8_8_;
        (pTVar5->alloc1).end = auVar58._16_8_;
        (pTVar5->alloc1).allocBlockSize = auVar58._24_8_;
        (pTVar5->alloc1).end = auVar58._0_8_;
        (pTVar5->alloc1).allocBlockSize = auVar58._8_8_;
        (pTVar5->alloc1).bytesUsed = auVar58._16_8_;
        (pTVar5->alloc1).bytesWasted = auVar58._24_8_;
        (pTVar5->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar5->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      bi.lower.field_0.m128[0] = SUB84(pTVar5,0);
      bi.lower.field_0.m128[1] = (float)((ulong)pTVar5 >> 0x20);
      blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower1.lower.field_0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar6._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar6,(ThreadLocal2 **)&bi);
      }
      else {
        *iVar6._M_current =
             (ThreadLocal2 *)CONCAT44(bi.lower.field_0.m128[1],bi.lower.field_0.m128[0]);
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (bupper0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)bupper0.lower.field_0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar28 = (alloc.talloc0)->cur;
    uVar39 = (ulong)(-(int)sVar28 & 0xf);
    uVar42 = sVar28 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar39;
    (alloc.talloc0)->cur = uVar42;
    if ((alloc.talloc0)->end < uVar42) {
      (alloc.talloc0)->cur = sVar28;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar38;
        sVar28 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar28;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
          (alloc.talloc0)->ptr = pcVar38;
          sVar28 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar28;
          (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)blower1.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar38 = (char *)0x0;
            pNVar45 = local_1e18;
            goto LAB_0133f8ea;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar28;
        pNVar45 = local_1e18;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar39;
      pcVar38 = (alloc.talloc0)->ptr +
                (uVar42 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_0133f8ea:
    uVar42 = 1;
    uVar39 = 0;
    goto LAB_0133f8f2;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar5 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar5->alloc)._M_b._M_p) {
    bupper0.lower.field_0._8_1_ = 1;
    bupper0.lower.field_0._0_8_ = pTVar5;
    MutexSys::lock(&pTVar5->mutex);
    if ((pTVar5->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar5->alloc1).bytesUsed + (pTVar5->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar5->alloc0).end + (pTVar5->alloc1).end) -
           ((pTVar5->alloc0).cur + (pTVar5->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar5->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar5->alloc1).bytesWasted + (pTVar5->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar5->alloc0).end = auVar58._0_8_;
    (pTVar5->alloc0).allocBlockSize = auVar58._8_8_;
    (pTVar5->alloc0).bytesUsed = auVar58._16_8_;
    (pTVar5->alloc0).bytesWasted = auVar58._24_8_;
    (pTVar5->alloc0).ptr = (char *)auVar58._0_8_;
    (pTVar5->alloc0).cur = auVar58._8_8_;
    (pTVar5->alloc0).end = auVar58._16_8_;
    (pTVar5->alloc0).allocBlockSize = auVar58._24_8_;
    auVar58 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar5->alloc1).end = auVar58._0_8_;
      (pTVar5->alloc1).allocBlockSize = auVar58._8_8_;
      (pTVar5->alloc1).bytesUsed = auVar58._16_8_;
      (pTVar5->alloc1).bytesWasted = auVar58._24_8_;
      (pTVar5->alloc1).ptr = (char *)auVar58._0_8_;
      (pTVar5->alloc1).cur = auVar58._8_8_;
      (pTVar5->alloc1).end = auVar58._16_8_;
      (pTVar5->alloc1).allocBlockSize = auVar58._24_8_;
    }
    else {
      (pTVar5->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar5->alloc1).ptr = (char *)auVar58._0_8_;
      (pTVar5->alloc1).cur = auVar58._8_8_;
      (pTVar5->alloc1).end = auVar58._16_8_;
      (pTVar5->alloc1).allocBlockSize = auVar58._24_8_;
      (pTVar5->alloc1).end = auVar58._0_8_;
      (pTVar5->alloc1).allocBlockSize = auVar58._8_8_;
      (pTVar5->alloc1).bytesUsed = auVar58._16_8_;
      (pTVar5->alloc1).bytesWasted = auVar58._24_8_;
      (pTVar5->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar5->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    bi.lower.field_0.m128[0] = SUB84(pTVar5,0);
    bi.lower.field_0.m128[1] = (float)((ulong)pTVar5 >> 0x20);
    blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    blower1.lower.field_0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar6._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar6,(ThreadLocal2 **)&bi);
    }
    else {
      *iVar6._M_current =
           (ThreadLocal2 *)CONCAT44(bi.lower.field_0.m128[1],bi.lower.field_0.m128[0]);
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    uVar41 = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (bupper0.lower.field_0._8_1_ == '\x01') {
      uVar41 = bupper0.lower.field_0._0_8_;
      MutexSys::unlock((MutexSys *)bupper0.lower.field_0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar28 = (alloc.talloc0)->cur;
  uVar39 = (ulong)(-(int)sVar28 & 0xf);
  uVar42 = sVar28 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar39;
  (alloc.talloc0)->cur = uVar42;
  if ((alloc.talloc0)->end < uVar42) {
    (alloc.talloc0)->cur = sVar28;
    uVar41 = alloc.alloc;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
      (alloc.talloc0)->ptr = pcVar38;
      sVar28 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar28;
      (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)blower1.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        uVar41 = alloc.alloc;
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar38;
        sVar28 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar28;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar38 = (char *)0x0;
          pNVar45 = local_1e18;
          goto LAB_0133f84f;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar28;
      pNVar45 = local_1e18;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar39;
    pcVar38 = (alloc.talloc0)->ptr +
              (uVar42 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_0133f84f:
  pcVar38[0xe0] = '\0';
  pcVar38[0xe1] = '\0';
  pcVar38[0xe2] = -0x80;
  pcVar38[0xe3] = '\x7f';
  pcVar38[0xe4] = '\0';
  pcVar38[0xe5] = '\0';
  pcVar38[0xe6] = -0x80;
  pcVar38[0xe7] = '\x7f';
  pcVar38[0xe8] = '\0';
  pcVar38[0xe9] = '\0';
  pcVar38[0xea] = -0x80;
  pcVar38[0xeb] = '\x7f';
  pcVar38[0xec] = '\0';
  pcVar38[0xed] = '\0';
  pcVar38[0xee] = -0x80;
  pcVar38[0xef] = '\x7f';
  pcVar38[0xf0] = '\0';
  pcVar38[0xf1] = '\0';
  pcVar38[0xf2] = -0x80;
  pcVar38[0xf3] = -1;
  pcVar38[0xf4] = '\0';
  pcVar38[0xf5] = '\0';
  pcVar38[0xf6] = -0x80;
  pcVar38[0xf7] = -1;
  pcVar38[0xf8] = '\0';
  pcVar38[0xf9] = '\0';
  pcVar38[0xfa] = -0x80;
  pcVar38[0xfb] = -1;
  pcVar38[0xfc] = '\0';
  pcVar38[0xfd] = '\0';
  pcVar38[0xfe] = -0x80;
  pcVar38[0xff] = -1;
  uVar39 = CONCAT71(SUB87(uVar41,1),1);
  uVar42 = 6;
LAB_0133f8f2:
  pcVar38[0x60] = '\0';
  pcVar38[0x61] = '\0';
  pcVar38[0x62] = -0x80;
  pcVar38[99] = '\x7f';
  pcVar38[100] = '\0';
  pcVar38[0x65] = '\0';
  pcVar38[0x66] = -0x80;
  pcVar38[0x67] = '\x7f';
  pcVar38[0x68] = '\0';
  pcVar38[0x69] = '\0';
  pcVar38[0x6a] = -0x80;
  pcVar38[0x6b] = '\x7f';
  pcVar38[0x6c] = '\0';
  pcVar38[0x6d] = '\0';
  pcVar38[0x6e] = -0x80;
  pcVar38[0x6f] = '\x7f';
  pcVar38[0x40] = '\0';
  pcVar38[0x41] = '\0';
  pcVar38[0x42] = -0x80;
  pcVar38[0x43] = '\x7f';
  pcVar38[0x44] = '\0';
  pcVar38[0x45] = '\0';
  pcVar38[0x46] = -0x80;
  pcVar38[0x47] = '\x7f';
  pcVar38[0x48] = '\0';
  pcVar38[0x49] = '\0';
  pcVar38[0x4a] = -0x80;
  pcVar38[0x4b] = '\x7f';
  pcVar38[0x4c] = '\0';
  pcVar38[0x4d] = '\0';
  pcVar38[0x4e] = -0x80;
  pcVar38[0x4f] = '\x7f';
  pcVar38[0x20] = '\0';
  pcVar38[0x21] = '\0';
  pcVar38[0x22] = -0x80;
  pcVar38[0x23] = '\x7f';
  pcVar38[0x24] = '\0';
  pcVar38[0x25] = '\0';
  pcVar38[0x26] = -0x80;
  pcVar38[0x27] = '\x7f';
  pcVar38[0x28] = '\0';
  pcVar38[0x29] = '\0';
  pcVar38[0x2a] = -0x80;
  pcVar38[0x2b] = '\x7f';
  pcVar38[0x2c] = '\0';
  pcVar38[0x2d] = '\0';
  pcVar38[0x2e] = -0x80;
  pcVar38[0x2f] = '\x7f';
  pcVar38[0x70] = '\0';
  pcVar38[0x71] = '\0';
  pcVar38[0x72] = -0x80;
  pcVar38[0x73] = -1;
  pcVar38[0x74] = '\0';
  pcVar38[0x75] = '\0';
  pcVar38[0x76] = -0x80;
  pcVar38[0x77] = -1;
  pcVar38[0x78] = '\0';
  pcVar38[0x79] = '\0';
  pcVar38[0x7a] = -0x80;
  pcVar38[0x7b] = -1;
  pcVar38[0x7c] = '\0';
  pcVar38[0x7d] = '\0';
  pcVar38[0x7e] = -0x80;
  pcVar38[0x7f] = -1;
  pcVar38[0x50] = '\0';
  pcVar38[0x51] = '\0';
  pcVar38[0x52] = -0x80;
  pcVar38[0x53] = -1;
  pcVar38[0x54] = '\0';
  pcVar38[0x55] = '\0';
  pcVar38[0x56] = -0x80;
  pcVar38[0x57] = -1;
  pcVar38[0x58] = '\0';
  pcVar38[0x59] = '\0';
  pcVar38[0x5a] = -0x80;
  pcVar38[0x5b] = -1;
  pcVar38[0x5c] = '\0';
  pcVar38[0x5d] = '\0';
  pcVar38[0x5e] = -0x80;
  pcVar38[0x5f] = -1;
  pcVar38[0x30] = '\0';
  pcVar38[0x31] = '\0';
  pcVar38[0x32] = -0x80;
  pcVar38[0x33] = -1;
  pcVar38[0x34] = '\0';
  pcVar38[0x35] = '\0';
  pcVar38[0x36] = -0x80;
  pcVar38[0x37] = -1;
  pcVar38[0x38] = '\0';
  pcVar38[0x39] = '\0';
  pcVar38[0x3a] = -0x80;
  pcVar38[0x3b] = -1;
  pcVar38[0x3c] = '\0';
  pcVar38[0x3d] = '\0';
  pcVar38[0x3e] = -0x80;
  pcVar38[0x3f] = -1;
  auVar55 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar38 + 0x80) = ZEXT1632(auVar55);
  *(undefined1 (*) [32])(pcVar38 + 0xa0) = ZEXT1632(auVar55);
  *(undefined1 (*) [32])(pcVar38 + 0xc0) = ZEXT1632(auVar55);
  pcVar38[0] = '\b';
  pcVar38[1] = '\0';
  pcVar38[2] = '\0';
  pcVar38[3] = '\0';
  pcVar38[4] = '\0';
  pcVar38[5] = '\0';
  pcVar38[6] = '\0';
  pcVar38[7] = '\0';
  pcVar38[8] = '\b';
  pcVar38[9] = '\0';
  pcVar38[10] = '\0';
  pcVar38[0xb] = '\0';
  pcVar38[0xc] = '\0';
  pcVar38[0xd] = '\0';
  pcVar38[0xe] = '\0';
  pcVar38[0xf] = '\0';
  pcVar38[0x10] = '\b';
  pcVar38[0x11] = '\0';
  pcVar38[0x12] = '\0';
  pcVar38[0x13] = '\0';
  pcVar38[0x14] = '\0';
  pcVar38[0x15] = '\0';
  pcVar38[0x16] = '\0';
  pcVar38[0x17] = '\0';
  pcVar38[0x18] = '\b';
  pcVar38[0x19] = '\0';
  pcVar38[0x1a] = '\0';
  pcVar38[0x1b] = '\0';
  pcVar38[0x1c] = '\0';
  pcVar38[0x1d] = '\0';
  pcVar38[0x1e] = '\0';
  pcVar38[0x1f] = '\0';
  uStack_1e50._0_4_ = 0xff800000;
  local_1e58._0_8_ = (task_group_context *)0xff800000ff800000;
  uStack_1e50._4_4_ = 0xff800000;
  fVar90 = INFINITY;
  fVar91 = INFINITY;
  fVar78 = INFINITY;
  fVar85 = INFINITY;
  if (local_848 != 0) {
    local_1df8.m128[0] = (float)(int)uVar39;
    pBVar36 = &values[0].dt;
    uVar39 = 0;
    uStack_1de0._0_4_ = INFINITY;
    local_1de8 = (undefined1  [8])0x7f8000007f800000;
    uStack_1de0._4_4_ = INFINITY;
    fStack_1e20 = INFINITY;
    local_1e28 = (undefined1  [8])0x7f8000007f800000;
    fStack_1e1c = INFINITY;
    uStack_1e00._0_4_ = -INFINITY;
    local_1e08 = (undefined1  [8])0xff800000ff800000;
    uStack_1e00._4_4_ = -INFINITY;
    uStack_1e50._0_4_ = 0xff800000;
    local_1e58._0_8_ = (task_group_context *)0xff800000ff800000;
    uStack_1e50._4_4_ = 0xff800000;
    in_00 = (BuildRecord *)&blower0;
    do {
      createLargeLeaf((NodeRecordMB4D *)&blower1,local_1e30,in_00,alloc);
      pBVar36[-10].lower = (float)blower1.lower.field_0._0_4_;
      pBVar36[-10].upper = (float)blower1.lower.field_0._4_4_;
      auVar15._4_4_ = blower1.upper.field_0.m128[1];
      auVar15._0_4_ = blower1.upper.field_0.m128[0];
      auVar15._8_4_ = blower1.upper.field_0.m128[2];
      auVar15._12_4_ = blower1.upper.field_0.m128[3];
      *(undefined1 (*) [16])(pBVar36 + -8) = auVar15;
      auVar16._8_8_ = auStack_1c08._8_8_;
      auVar16._0_8_ = auStack_1c08._0_8_;
      *(undefined1 (*) [16])(pBVar36 + -6) = auVar16;
      auVar17._8_8_ = local_1bf8._8_8_;
      auVar17._0_8_ = local_1bf8._0_8_;
      *(undefined1 (*) [16])(pBVar36 + -4) = auVar17;
      auVar18._8_8_ = aStack_1be8._8_8_;
      auVar18._0_8_ = aStack_1be8._0_8_;
      *(undefined1 (*) [16])(pBVar36 + -2) = auVar18;
      *pBVar36 = local_1bd8;
      _local_1de8 = vminps_avx(_local_1de8,auVar15);
      _local_1e08 = (__m128)vmaxps_avx(_local_1e08,auVar16);
      _local_1e28 = (__m128)vminps_avx(_local_1e28,auVar17);
      local_1e58 = vmaxps_avx(local_1e58,auVar18);
      uVar39 = uVar39 + 1;
      pBVar36 = pBVar36 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar39 < local_848);
    if (((uint)uVar42 | (uint)pcVar38 & 0xf) == 1) {
      if (local_848 != 0) {
        uVar39 = (ulong)pcVar38 & 0xfffffffffffffff0;
        pfVar35 = &values[0].dt.upper;
        lVar32 = 0;
        auVar67._8_4_ = 0x7f7fffff;
        auVar67._0_8_ = 0x7f7fffff7f7fffff;
        auVar67._12_4_ = 0x7f7fffff;
        auVar72._8_4_ = 0xff7fffff;
        auVar72._0_8_ = 0xff7fffffff7fffff;
        auVar72._12_4_ = 0xff7fffff;
        auVar74._8_4_ = 0x7fffffff;
        auVar74._0_8_ = 0x7fffffff7fffffff;
        auVar74._12_4_ = 0x7fffffff;
        do {
          *(undefined8 *)(uVar39 + lVar32 * 8) = *(undefined8 *)(pfVar35 + -0x15);
          fVar90 = ((BBox1f *)(pfVar35 + -1))->lower;
          fVar78 = 1.0 / (*pfVar35 - fVar90);
          fVar91 = -fVar90 * fVar78;
          auVar55 = vshufps_avx(ZEXT416((uint)fVar91),ZEXT416((uint)fVar91),0);
          auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar91)),ZEXT416((uint)(1.0 - fVar91)),0);
          auVar99._0_4_ = pfVar35[-9] * auVar55._0_4_ + pfVar35[-0x11] * auVar52._0_4_;
          auVar99._4_4_ = pfVar35[-8] * auVar55._4_4_ + pfVar35[-0x10] * auVar52._4_4_;
          auVar99._8_4_ = pfVar35[-7] * auVar55._8_4_ + pfVar35[-0xf] * auVar52._8_4_;
          auVar99._12_4_ = pfVar35[-6] * auVar55._12_4_ + pfVar35[-0xe] * auVar52._12_4_;
          auVar83._0_4_ = pfVar35[-5] * auVar55._0_4_ + pfVar35[-0xd] * auVar52._0_4_;
          auVar83._4_4_ = pfVar35[-4] * auVar55._4_4_ + pfVar35[-0xc] * auVar52._4_4_;
          auVar83._8_4_ = pfVar35[-3] * auVar55._8_4_ + pfVar35[-0xb] * auVar52._8_4_;
          auVar83._12_4_ = pfVar35[-2] * auVar55._12_4_ + pfVar35[-10] * auVar52._12_4_;
          fVar78 = (1.0 - fVar90) * fVar78;
          auVar55 = vshufps_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),0);
          auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar78)),ZEXT416((uint)(1.0 - fVar78)),0);
          auVar86._0_4_ = pfVar35[-9] * auVar55._0_4_ + pfVar35[-0x11] * auVar52._0_4_;
          auVar86._4_4_ = pfVar35[-8] * auVar55._4_4_ + pfVar35[-0x10] * auVar52._4_4_;
          auVar86._8_4_ = pfVar35[-7] * auVar55._8_4_ + pfVar35[-0xf] * auVar52._8_4_;
          auVar86._12_4_ = pfVar35[-6] * auVar55._12_4_ + pfVar35[-0xe] * auVar52._12_4_;
          auVar79._0_4_ = pfVar35[-5] * auVar55._0_4_ + pfVar35[-0xd] * auVar52._0_4_;
          auVar79._4_4_ = pfVar35[-4] * auVar55._4_4_ + pfVar35[-0xc] * auVar52._4_4_;
          auVar79._8_4_ = pfVar35[-3] * auVar55._8_4_ + pfVar35[-0xb] * auVar52._8_4_;
          auVar79._12_4_ = pfVar35[-2] * auVar55._12_4_ + pfVar35[-10] * auVar52._12_4_;
          auVar76 = vminps_avx(auVar99,auVar67);
          auVar52 = vmaxps_avx(auVar83,auVar72);
          auVar61 = vminps_avx(auVar86,auVar67);
          auVar51 = vmaxps_avx(auVar79,auVar72);
          auVar55 = vandps_avx(auVar76,auVar74);
          auVar92._0_4_ = auVar55._0_4_ * 4.7683716e-07;
          auVar92._4_4_ = auVar55._4_4_ * 4.7683716e-07;
          auVar92._8_4_ = auVar55._8_4_ * 4.7683716e-07;
          auVar92._12_4_ = auVar55._12_4_ * 4.7683716e-07;
          auVar76 = vsubps_avx(auVar76,auVar92);
          auVar55 = vandps_avx(auVar52,auVar74);
          auVar84._0_4_ = auVar52._0_4_ + auVar55._0_4_ * 4.7683716e-07;
          auVar84._4_4_ = auVar52._4_4_ + auVar55._4_4_ * 4.7683716e-07;
          auVar84._8_4_ = auVar52._8_4_ + auVar55._8_4_ * 4.7683716e-07;
          auVar84._12_4_ = auVar52._12_4_ + auVar55._12_4_ * 4.7683716e-07;
          auVar55 = vandps_avx(auVar61,auVar74);
          auVar93._0_4_ = auVar55._0_4_ * 4.7683716e-07;
          auVar93._4_4_ = auVar55._4_4_ * 4.7683716e-07;
          auVar93._8_4_ = auVar55._8_4_ * 4.7683716e-07;
          auVar93._12_4_ = auVar55._12_4_ * 4.7683716e-07;
          auVar52 = vsubps_avx(auVar61,auVar93);
          auVar55 = vandps_avx(auVar51,auVar74);
          *(int *)(uVar39 + 0x20 + lVar32 * 4) = auVar76._0_4_;
          uVar3 = vextractps_avx(auVar76,1);
          *(undefined4 *)(uVar39 + 0x40 + lVar32 * 4) = uVar3;
          auVar80._0_4_ = auVar55._0_4_ * 4.7683716e-07 + auVar51._0_4_;
          auVar80._4_4_ = auVar55._4_4_ * 4.7683716e-07 + auVar51._4_4_;
          auVar80._8_4_ = auVar55._8_4_ * 4.7683716e-07 + auVar51._8_4_;
          auVar80._12_4_ = auVar55._12_4_ * 4.7683716e-07 + auVar51._12_4_;
          uVar3 = vextractps_avx(auVar76,2);
          *(undefined4 *)(uVar39 + 0x60 + lVar32 * 4) = uVar3;
          *(float *)(uVar39 + 0x30 + lVar32 * 4) = auVar84._0_4_;
          uVar3 = vextractps_avx(auVar84,1);
          *(undefined4 *)(uVar39 + 0x50 + lVar32 * 4) = uVar3;
          auVar55 = vsubps_avx(auVar52,auVar76);
          uVar3 = vextractps_avx(auVar84,2);
          *(undefined4 *)(uVar39 + 0x70 + lVar32 * 4) = uVar3;
          *(int *)(uVar39 + 0x80 + lVar32 * 4) = auVar55._0_4_;
          uVar3 = vextractps_avx(auVar55,1);
          *(undefined4 *)(uVar39 + 0xa0 + lVar32 * 4) = uVar3;
          auVar52 = vsubps_avx(auVar80,auVar84);
          uVar3 = vextractps_avx(auVar55,2);
          *(undefined4 *)(uVar39 + 0xc0 + lVar32 * 4) = uVar3;
          *(int *)(uVar39 + 0x90 + lVar32 * 4) = auVar52._0_4_;
          uVar3 = vextractps_avx(auVar52,1);
          *(undefined4 *)(uVar39 + 0xb0 + lVar32 * 4) = uVar3;
          uVar3 = vextractps_avx(auVar52,2);
          *(undefined4 *)(uVar39 + 0xd0 + lVar32 * 4) = uVar3;
          lVar32 = lVar32 + 1;
          pfVar35 = pfVar35 + 0x18;
        } while (local_848 != lVar32);
      }
    }
    else if (local_848 != 0) {
      uVar39 = (ulong)pcVar38 & 0xfffffffffffffff0;
      pfVar35 = &values[0].dt.upper;
      lVar32 = 0;
      auVar70._8_4_ = 0x7f7fffff;
      auVar70._0_8_ = 0x7f7fffff7f7fffff;
      auVar70._12_4_ = 0x7f7fffff;
      auVar73._8_4_ = 0xff7fffff;
      auVar73._0_8_ = 0xff7fffffff7fffff;
      auVar73._12_4_ = 0xff7fffff;
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar81._8_4_ = 0x3f800001;
      auVar81._0_8_ = 0x3f8000013f800001;
      auVar81._12_4_ = 0x3f800001;
      do {
        *(undefined8 *)(uVar39 + lVar32 * 8) = *(undefined8 *)(pfVar35 + -0x15);
        fVar90 = *pfVar35;
        fVar91 = ((BBox1f *)(pfVar35 + -1))->lower;
        fVar85 = 1.0 / (fVar90 - fVar91);
        fVar78 = fVar85 * -fVar91;
        auVar55 = vshufps_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),0);
        auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar78)),ZEXT416((uint)(1.0 - fVar78)),0);
        auVar64._0_4_ = pfVar35[-9] * auVar55._0_4_ + pfVar35[-0x11] * auVar52._0_4_;
        auVar64._4_4_ = pfVar35[-8] * auVar55._4_4_ + pfVar35[-0x10] * auVar52._4_4_;
        auVar64._8_4_ = pfVar35[-7] * auVar55._8_4_ + pfVar35[-0xf] * auVar52._8_4_;
        auVar64._12_4_ = pfVar35[-6] * auVar55._12_4_ + pfVar35[-0xe] * auVar52._12_4_;
        auVar94._0_4_ = pfVar35[-5] * auVar55._0_4_ + pfVar35[-0xd] * auVar52._0_4_;
        auVar94._4_4_ = pfVar35[-4] * auVar55._4_4_ + pfVar35[-0xc] * auVar52._4_4_;
        auVar94._8_4_ = pfVar35[-3] * auVar55._8_4_ + pfVar35[-0xb] * auVar52._8_4_;
        auVar94._12_4_ = pfVar35[-2] * auVar55._12_4_ + pfVar35[-10] * auVar52._12_4_;
        fVar85 = (1.0 - fVar91) * fVar85;
        auVar55 = vshufps_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),0);
        auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar85)),ZEXT416((uint)(1.0 - fVar85)),0);
        auVar96._0_4_ = pfVar35[-9] * auVar55._0_4_ + pfVar35[-0x11] * auVar52._0_4_;
        auVar96._4_4_ = pfVar35[-8] * auVar55._4_4_ + pfVar35[-0x10] * auVar52._4_4_;
        auVar96._8_4_ = pfVar35[-7] * auVar55._8_4_ + pfVar35[-0xf] * auVar52._8_4_;
        auVar96._12_4_ = pfVar35[-6] * auVar55._12_4_ + pfVar35[-0xe] * auVar52._12_4_;
        auVar88._0_4_ = pfVar35[-5] * auVar55._0_4_ + pfVar35[-0xd] * auVar52._0_4_;
        auVar88._4_4_ = pfVar35[-4] * auVar55._4_4_ + pfVar35[-0xc] * auVar52._4_4_;
        auVar88._8_4_ = pfVar35[-3] * auVar55._8_4_ + pfVar35[-0xb] * auVar52._8_4_;
        auVar88._12_4_ = pfVar35[-2] * auVar55._12_4_ + pfVar35[-10] * auVar52._12_4_;
        auVar76 = vminps_avx(auVar64,auVar70);
        auVar52 = vmaxps_avx(auVar94,auVar73);
        auVar61 = vminps_avx(auVar96,auVar70);
        auVar51 = vmaxps_avx(auVar88,auVar73);
        auVar55 = vandps_avx(auVar76,auVar75);
        auVar97._0_4_ = auVar55._0_4_ * 4.7683716e-07;
        auVar97._4_4_ = auVar55._4_4_ * 4.7683716e-07;
        auVar97._8_4_ = auVar55._8_4_ * 4.7683716e-07;
        auVar97._12_4_ = auVar55._12_4_ * 4.7683716e-07;
        auVar76 = vsubps_avx(auVar76,auVar97);
        auVar55 = vandps_avx(auVar52,auVar75);
        auVar95._0_4_ = auVar52._0_4_ + auVar55._0_4_ * 4.7683716e-07;
        auVar95._4_4_ = auVar52._4_4_ + auVar55._4_4_ * 4.7683716e-07;
        auVar95._8_4_ = auVar52._8_4_ + auVar55._8_4_ * 4.7683716e-07;
        auVar95._12_4_ = auVar52._12_4_ + auVar55._12_4_ * 4.7683716e-07;
        auVar55 = vandps_avx(auVar61,auVar75);
        auVar98._0_4_ = auVar55._0_4_ * 4.7683716e-07;
        auVar98._4_4_ = auVar55._4_4_ * 4.7683716e-07;
        auVar98._8_4_ = auVar55._8_4_ * 4.7683716e-07;
        auVar98._12_4_ = auVar55._12_4_ * 4.7683716e-07;
        auVar52 = vsubps_avx(auVar61,auVar98);
        auVar55 = vandps_avx(auVar51,auVar75);
        *(int *)(uVar39 + 0x20 + lVar32 * 4) = auVar76._0_4_;
        uVar3 = vextractps_avx(auVar76,1);
        *(undefined4 *)(uVar39 + 0x40 + lVar32 * 4) = uVar3;
        auVar89._0_4_ = auVar51._0_4_ + auVar55._0_4_ * 4.7683716e-07;
        auVar89._4_4_ = auVar51._4_4_ + auVar55._4_4_ * 4.7683716e-07;
        auVar89._8_4_ = auVar51._8_4_ + auVar55._8_4_ * 4.7683716e-07;
        auVar89._12_4_ = auVar51._12_4_ + auVar55._12_4_ * 4.7683716e-07;
        uVar3 = vextractps_avx(auVar76,2);
        *(undefined4 *)(uVar39 + 0x60 + lVar32 * 4) = uVar3;
        *(float *)(uVar39 + 0x30 + lVar32 * 4) = auVar95._0_4_;
        uVar3 = vextractps_avx(auVar95,1);
        *(undefined4 *)(uVar39 + 0x50 + lVar32 * 4) = uVar3;
        auVar55 = vsubps_avx(auVar52,auVar76);
        uVar3 = vextractps_avx(auVar95,2);
        *(undefined4 *)(uVar39 + 0x70 + lVar32 * 4) = uVar3;
        *(int *)(uVar39 + 0x80 + lVar32 * 4) = auVar55._0_4_;
        uVar3 = vextractps_avx(auVar55,1);
        *(undefined4 *)(uVar39 + 0xa0 + lVar32 * 4) = uVar3;
        auVar52 = vsubps_avx(auVar89,auVar95);
        uVar3 = vextractps_avx(auVar55,2);
        *(undefined4 *)(uVar39 + 0xc0 + lVar32 * 4) = uVar3;
        *(int *)(uVar39 + 0x90 + lVar32 * 4) = auVar52._0_4_;
        uVar3 = vextractps_avx(auVar52,1);
        *(undefined4 *)(uVar39 + 0xb0 + lVar32 * 4) = uVar3;
        uVar3 = vextractps_avx(auVar52,2);
        *(undefined4 *)(uVar39 + 0xd0 + lVar32 * 4) = uVar3;
        *(float *)(uVar39 + 0xe0 + lVar32 * 4) = fVar91;
        auVar55 = vcmpss_avx(ZEXT416((uint)fVar90),SUB6416(ZEXT464(0x3f800000),0),0);
        auVar55 = vblendvps_avx(ZEXT416((uint)fVar90),auVar81,auVar55);
        *(int *)(uVar39 + 0xf0 + lVar32 * 4) = auVar55._0_4_;
        lVar32 = lVar32 + 1;
        pfVar35 = pfVar35 + 0x18;
      } while (local_848 != lVar32);
    }
    uVar39 = (ulong)(uint)local_1df8._0_4_;
    pNVar45 = local_1e18;
    fVar90 = (float)local_1e28._0_4_;
    fVar91 = (float)local_1e28._4_4_;
    fVar78 = fStack_1e20;
    fVar85 = fStack_1e1c;
  }
  uVar21 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar20 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar39 == '\0') {
    (pNVar45->ref).ptr = uVar42 | (ulong)pcVar38;
    *(undefined1 (*) [8])&(pNVar45->lbounds).bounds0.lower.field_0 = local_1de8;
    *(undefined8 *)((long)&(pNVar45->lbounds).bounds0.lower.field_0 + 8) = uStack_1de0;
    *(undefined1 (*) [8])&(pNVar45->lbounds).bounds0.upper.field_0 = local_1e08;
    *(undefined8 *)((long)&(pNVar45->lbounds).bounds0.upper.field_0 + 8) = uStack_1e00;
    (pNVar45->lbounds).bounds1.lower.field_0.m128[0] = fVar90;
    (pNVar45->lbounds).bounds1.lower.field_0.m128[1] = fVar91;
    (pNVar45->lbounds).bounds1.lower.field_0.m128[2] = fVar78;
    (pNVar45->lbounds).bounds1.lower.field_0.m128[3] = fVar85;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&local_1e30->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    bupper0.lower.field_0._0_8_ = 0x7f8000007f800000;
    bupper0.lower.field_0.m128[2] = INFINITY;
    bupper0.lower.field_0.m128[3] = INFINITY;
    bupper0.upper.field_0._0_8_ = 0xff800000ff800000;
    bupper0.upper.field_0._8_8_ = 0xff800000ff800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      blower1.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      blower1.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&bi,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&blower1);
    }
    else {
      blower1.lower.field_0._12_2_ = 0x401;
      tbb::detail::r1::initialize((task_group_context *)&blower1);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar21;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar20;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::UserGeometry>>(embree::avx::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&bi,(d1 *)&right,(blocked_range<unsigned_long> *)&bupper0,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&blower1,local_1e58._0_8_);
      cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&blower1);
      if (cVar22 != '\0') {
        prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar30,"task cancelled");
        __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&blower1);
    }
    (pNVar45->ref).ptr = uVar42 | (ulong)pcVar38;
    *(ulong *)&(pNVar45->lbounds).bounds0.lower.field_0 =
         CONCAT44(bi.lower.field_0.m128[1],bi.lower.field_0.m128[0]);
    *(ulong *)((long)&(pNVar45->lbounds).bounds0.lower.field_0 + 8) =
         CONCAT44(bi.lower.field_0.m128[3],bi.lower.field_0.m128[2]);
    *(ulong *)&(pNVar45->lbounds).bounds0.upper.field_0 =
         CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
    *(ulong *)((long)&(pNVar45->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(bi.upper.field_0.m128[3],bi.upper.field_0.m128[2]);
    *(ulong *)&(pNVar45->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1cb8.m128[1],local_1cb8.m128[0]);
    *(ulong *)((long)&(pNVar45->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1cb8.m128[3],local_1cb8.m128[2]);
    local_1e58._0_8_ = (task_group_context *)CONCAT44(aStack_1ca8.m128[1],aStack_1ca8.m128[0]);
    uStack_1e50 = CONCAT44(aStack_1ca8.m128[3],aStack_1ca8.m128[2]);
  }
  *(task_group_context **)&(pNVar45->lbounds).bounds1.upper.field_0 = local_1e58._0_8_;
  *(undefined8 *)((long)&(pNVar45->lbounds).bounds1.upper.field_0 + 8) = uStack_1e50;
  pNVar45->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == 0) {
    return pNVar45;
  }
  uVar39 = 0;
  do {
    pBVar7 = local_8c8[uVar39];
    pBVar36 = pBVar7 + 1;
    *pBVar36 = (BBox1f)((long)*pBVar36 + -1);
    if (*pBVar36 == (BBox1f)0x0) {
      BVar33 = *pBVar7;
      if (BVar33 != (BBox1f)0x0) {
        lVar32 = *(long *)((long)BVar33 + 0x18);
        pvVar27 = *(void **)((long)BVar33 + 0x20);
        if (pvVar27 != (void *)0x0) {
          if ((ulong)(lVar32 * 0x50) < 0x1c00000) {
            alignedFree(pvVar27);
          }
          else {
            os_free(pvVar27,lVar32 * 0x50,*(bool *)((long)BVar33 + 8));
          }
        }
        if (lVar32 != 0) {
          (**(code **)**(undefined8 **)BVar33)(*(undefined8 **)BVar33,lVar32 * -0x50,1);
        }
        *(undefined8 *)((long)BVar33 + 0x10) = 0;
        *(undefined8 *)((long)BVar33 + 0x18) = 0;
        *(undefined8 *)((long)BVar33 + 0x20) = 0;
      }
      operator_delete((void *)BVar33);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 < local_848);
  return pNVar45;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }